

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareVertexShaderCode
          (GPUShaderFP64Test10 *this,functionObject *function_object)

{
  GLuint GVar1;
  uint uVar2;
  GLchar *pGVar3;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  GPUShaderFP64Test10 *pGVar4;
  char *pcVar5;
  ulong uVar6;
  size_t search_position;
  string string;
  string uniform_type;
  string result_type;
  size_t local_a8;
  uint local_a0;
  GLuint local_9c;
  string local_98;
  string local_78;
  GPUShaderFP64Test10 *local_58;
  string local_50;
  
  local_58 = this;
  GVar1 = (*function_object->_vptr_functionObject[3])(function_object);
  local_a0 = (*function_object->_vptr_functionObject[5])(function_object);
  uVar2 = (*function_object->_vptr_functionObject[6])(function_object,0);
  Utils::getVariableTypeString_abi_cxx11_(&local_50,(Utils *)(ulong)uVar2,type);
  local_a8 = 0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "#version 400 core\n\nprecision highp float;\n\nARGUMENT_DEFINITION\nRESULT_DEFINITION\nvoid main()\n{\n    RESULT_NAME = RESULT_TYPE(FUNCTION_NAME(ARGUMENT));\n}\n\n"
             ,"");
  local_9c = GVar1;
  if (GVar1 != 0) {
    uVar6 = 0;
    do {
      pGVar4 = (GPUShaderFP64Test10 *)function_object;
      uVar2 = (*function_object->_vptr_functionObject[4])(function_object,uVar6);
      pGVar3 = getUniformName(pGVar4,(GLuint)uVar6);
      Utils::getVariableTypeString_abi_cxx11_(&local_78,(Utils *)(ulong)uVar2,type_00);
      Utils::replaceToken("ARGUMENT_DEFINITION",&local_a8,
                          "uniform UNIFORM_TYPE UNIFORM_NAME;\nARGUMENT_DEFINITION",&local_98);
      local_a8 = local_a8 - 0x36;
      Utils::replaceToken("UNIFORM_TYPE",&local_a8,local_78._M_dataplus._M_p,&local_98);
      Utils::replaceToken("UNIFORM_NAME",&local_a8,pGVar3,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      uVar2 = (GLuint)uVar6 + 1;
      uVar6 = (ulong)uVar2;
    } while (local_9c != uVar2);
  }
  Utils::replaceToken("ARGUMENT_DEFINITION",&local_a8,::glcts::fixed_sample_locations_values + 1,
                      &local_98);
  if (local_a0 != 0) {
    uVar6 = 0;
    do {
      pGVar4 = (GPUShaderFP64Test10 *)function_object;
      uVar2 = (*function_object->_vptr_functionObject[6])(function_object,uVar6);
      pGVar3 = getVaryingName(pGVar4,(GLuint)uVar6);
      Utils::getVariableTypeString_abi_cxx11_(&local_78,(Utils *)(ulong)uVar2,type_01);
      Utils::replaceToken("RESULT_DEFINITION",&local_a8,
                          "flat out RESULT_TYPE RESULT_NAME;\nRESULT_DEFINITION",&local_98);
      local_a8 = local_a8 - 0x33;
      Utils::replaceToken("RESULT_TYPE",&local_a8,local_78._M_dataplus._M_p,&local_98);
      Utils::replaceToken("RESULT_NAME",&local_a8,pGVar3,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      uVar2 = (GLuint)uVar6 + 1;
      uVar6 = (ulong)uVar2;
    } while (local_a0 != uVar2);
  }
  Utils::replaceToken("RESULT_DEFINITION",&local_a8,::glcts::fixed_sample_locations_values + 1,
                      &local_98);
  Utils::replaceToken("RESULT_NAME",&local_a8,"result_0",&local_98);
  Utils::replaceToken("RESULT_TYPE",&local_a8,local_50._M_dataplus._M_p,&local_98);
  pcVar5 = "FUNCTION_NAME";
  Utils::replaceToken("FUNCTION_NAME",&local_a8,function_object->m_function_name,&local_98);
  if (local_9c != 0) {
    GVar1 = 0;
    do {
      pGVar3 = getUniformName((GPUShaderFP64Test10 *)pcVar5,GVar1);
      pcVar5 = ", UNIFORM_NAMEARGUMENT";
      if (GVar1 == 0) {
        pcVar5 = "UNIFORM_NAMEARGUMENT";
      }
      Utils::replaceToken("ARGUMENT",&local_a8,pcVar5,&local_98);
      local_a8 = local_a8 - 0x14;
      pcVar5 = "UNIFORM_NAME";
      Utils::replaceToken("UNIFORM_NAME",&local_a8,pGVar3,&local_98);
      GVar1 = GVar1 + 1;
    } while (local_9c != GVar1);
  }
  if (1 < local_a0) {
    GVar1 = 1;
    do {
      pGVar3 = getVaryingName((GPUShaderFP64Test10 *)pcVar5,GVar1);
      Utils::replaceToken("ARGUMENT",&local_a8,", UNIFORM_NAMEARGUMENT",&local_98);
      local_a8 = local_a8 - 0x14;
      pcVar5 = "UNIFORM_NAME";
      Utils::replaceToken("UNIFORM_NAME",&local_a8,pGVar3,&local_98);
      GVar1 = GVar1 + 1;
    } while (local_a0 != GVar1);
  }
  Utils::replaceToken("ARGUMENT",&local_a8,::glcts::fixed_sample_locations_values + 1,&local_98);
  std::__cxx11::string::_M_assign((string *)&local_58->m_vertex_shader_code);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareVertexShaderCode(const functionObject& function_object)
{
	static const glw::GLchar* shader_template_code = "#version 400 core\n"
													 "\n"
													 "precision highp float;\n"
													 "\n"
													 "ARGUMENT_DEFINITION"
													 "\n"
													 "RESULT_DEFINITION"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    RESULT_NAME = RESULT_TYPE(FUNCTION_NAME(ARGUMENT));\n"
													 "}\n"
													 "\n";

	static const glw::GLchar* argument_definition_token = "ARGUMENT_DEFINITION";
	static const glw::GLchar* argument_token			= "ARGUMENT";
	static const glw::GLchar* function_name_token		= "FUNCTION_NAME";
	static const glw::GLchar* result_definition_token   = "RESULT_DEFINITION";
	static const glw::GLchar* result_name_token			= "RESULT_NAME";
	static const glw::GLchar* result_type_token			= "RESULT_TYPE";
	static const glw::GLchar* uniform_name_token		= "UNIFORM_NAME";
	static const glw::GLchar* uniform_type_token		= "UNIFORM_TYPE";

	static const glw::GLchar* argument_definition = "uniform UNIFORM_TYPE UNIFORM_NAME;\nARGUMENT_DEFINITION";
	static const glw::GLchar* argument_str		  = ", UNIFORM_NAMEARGUMENT";
	static const glw::GLchar* first_argument	  = "UNIFORM_NAMEARGUMENT";
	static const glw::GLchar* result_definition   = "flat out RESULT_TYPE RESULT_NAME;\nRESULT_DEFINITION";

	const glw::GLuint argument_definition_length = (glw::GLuint)strlen(argument_definition);
	const glw::GLuint first_argument_length		 = (glw::GLuint)strlen(first_argument);
	const glw::GLuint n_arguments				 = function_object.getArgumentCount();
	const glw::GLuint n_results					 = function_object.getResultCount();
	const glw::GLuint result_definition_length   = (glw::GLuint)strlen(result_definition);
	std::string		  result_type				 = Utils::getVariableTypeString(function_object.getResultType(0));

	size_t		search_position = 0;
	std::string string			= shader_template_code;

	/* Replace ARGUMENT_DEFINITION with definitions */
	for (glw::GLuint argument = 0; argument < n_arguments; ++argument)
	{
		Utils::_variable_type argument_type = function_object.getArgumentType(argument);
		const glw::GLchar*	uniform_name  = getUniformName(argument);
		std::string			  uniform_type  = Utils::getVariableTypeString(argument_type);

		Utils::replaceToken(argument_definition_token, search_position, argument_definition, string);

		search_position -= argument_definition_length;

		Utils::replaceToken(uniform_type_token, search_position, uniform_type.c_str(), string);
		Utils::replaceToken(uniform_name_token, search_position, uniform_name, string);
	}

	/* Remove ARGUMENT_DEFINITION */
	Utils::replaceToken(argument_definition_token, search_position, "", string);

	/* Replace RESULT_DEFINITION with definitions */
	for (glw::GLuint result = 0; result < n_results; ++result)
	{
		Utils::_variable_type variable_type = function_object.getResultType(result);
		const glw::GLchar*	varying_name  = getVaryingName(result);
		std::string			  varying_type  = Utils::getVariableTypeString(variable_type);

		Utils::replaceToken(result_definition_token, search_position, result_definition, string);

		search_position -= result_definition_length;

		Utils::replaceToken(result_type_token, search_position, varying_type.c_str(), string);
		Utils::replaceToken(result_name_token, search_position, varying_name, string);
	}

	/* Remove RESULT_DEFINITION */
	Utils::replaceToken(result_definition_token, search_position, "", string);

	/* Replace RESULT_NAME */
	Utils::replaceToken(result_name_token, search_position, getVaryingName(0), string);

	/* Replace RESULT_TYPE */
	Utils::replaceToken(result_type_token, search_position, result_type.c_str(), string);

	/* Replace FUNCTION_NAME */
	Utils::replaceToken(function_name_token, search_position, function_object.getName(), string);

	/* Replace ARGUMENT with list of arguments */
	for (glw::GLuint argument = 0; argument < n_arguments; ++argument)
	{
		const glw::GLchar* uniform_name = getUniformName(argument);

		if (0 == argument)
		{
			Utils::replaceToken(argument_token, search_position, first_argument, string);
		}
		else
		{
			Utils::replaceToken(argument_token, search_position, argument_str, string);
		}

		search_position -= first_argument_length;

		Utils::replaceToken(uniform_name_token, search_position, uniform_name, string);
	}

	for (glw::GLuint result = 1; result < n_results; ++result)
	{
		const glw::GLchar* varying_name = getVaryingName(result);

		Utils::replaceToken(argument_token, search_position, argument_str, string);

		search_position -= first_argument_length;

		Utils::replaceToken(uniform_name_token, search_position, varying_name, string);
	}

	/* Remove ARGUMENT */
	Utils::replaceToken(argument_token, search_position, "", string);

	m_vertex_shader_code = string;
}